

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *data;
  char *buf;
  int size;
  int s2;
  int s1;
  int i;
  int sc;
  int sb;
  
  iVar1 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                           ,0x2d,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                    ,0x2e,iVar1,"ipc://test.ipc");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                  ,0x2f,iVar1);
  iVar1 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                           ,0x32,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                    ,0x33,iVar1,"ipc://test.ipc");
  nn_sleep(200);
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                           ,0x38,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                 ,0x39,iVar2,"ipc://test.ipc");
  for (s2 = 0; s2 != 1; s2 = s2 + 1) {
    test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                   ,0x3d,iVar1,"0123456789012345678901234567890123456789");
    test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                   ,0x3e,iVar2,"0123456789012345678901234567890123456789");
    test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                   ,0x3f,iVar2,"0123456789012345678901234567890123456789");
    test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                   ,0x40,iVar1,"0123456789012345678901234567890123456789");
  }
  for (s2 = 0; s2 != 100; s2 = s2 + 1) {
    test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                   ,0x45,iVar1,"XYZ");
  }
  for (s2 = 0; s2 != 100; s2 = s2 + 1) {
    test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                   ,0x48,iVar2,"XYZ");
  }
  data = (char *)malloc(10000);
  for (s2 = 0; s2 < 10000; s2 = s2 + 1) {
    data[s2] = (char)(s2 % 10) + '0';
  }
  data[9999] = '\0';
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                 ,0x52,iVar1,data);
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                 ,0x53,iVar2,data);
  free(data);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                  ,0x56,iVar1);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                  ,0x57,iVar2);
  iVar1 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                           ,0x5a,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                 ,0x5b,iVar1,"ipc://test.ipc");
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                           ,0x5c,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                    ,0x5d,iVar2,"ipc://test.ipc");
  iVar3 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                           ,0x5e,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                    ,0x5f,iVar3,"ipc://test.ipc");
  nn_sleep(100);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                  ,0x61,iVar3);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                  ,0x62,iVar2);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                  ,99,iVar1);
  iVar1 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                           ,0x66,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                 ,0x67,iVar1,"ipc://test.ipc");
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                           ,0x68,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                 ,0x69,iVar2,"ipc://test.ipc");
  iVar3 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                           ,0x6a,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                    ,0x6b,iVar3,"ipc://test.ipc");
  nn_sleep(100);
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                 ,0x6d,iVar1,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                 ,0x6e,iVar3,"ABC");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                  ,0x6f,iVar1);
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                 ,0x70,iVar2,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                 ,0x71,iVar3,"ABC");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                  ,0x72,iVar3);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                  ,0x73,iVar2);
  iVar1 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                           ,0x76,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                 ,0x77,iVar1,"ipc://test.ipc");
  nn_sleep(100);
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                           ,0x79,1,0x10);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                 ,0x7a,iVar2,"ipc://test.ipc");
  iVar3 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                           ,0x7b,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                    ,0x7c,iVar3,"ipc://test.ipc");
  nn_sleep(100);
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                 ,0x7e,iVar1,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                 ,0x7f,iVar3,"ABC");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                  ,0x80,iVar2);
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                 ,0x81,iVar1,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                 ,0x82,iVar3,"ABC");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                  ,0x83,iVar1);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ipc.c"
                  ,0x84,iVar3);
  return 0;
}

Assistant:

int main ()
{
    int sb;
    int sc;
    int i;
    int s1, s2;

    int size;
    char * buf;

    /*  Try closing a IPC socket while it not connected. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    test_close (sc);

    /*  Open the socket anew. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    /*  Leave enough time for at least one re-connect attempt. */
    nn_sleep (200);

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);

    /*  Ping-pong test. */
    for (i = 0; i != 1; ++i) {
        test_send (sc, "0123456789012345678901234567890123456789");
        test_recv (sb, "0123456789012345678901234567890123456789");
        test_send (sb, "0123456789012345678901234567890123456789");
        test_recv (sc, "0123456789012345678901234567890123456789");
    }

    /*  Batch transfer test. */
    for (i = 0; i != 100; ++i) {
        test_send (sc, "XYZ");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (sb, "XYZ");
    }

    /*  Send something large enough to trigger overlapped I/O on Windows. */
    size = 10000;
    buf = malloc (size);
    for (i = 0; i < size; ++i) {
        buf[i] = 48 + i % 10;
    }
    buf[size-1] = '\0';
    test_send (sc, buf);
    test_recv (sb, buf);
    free (buf);

    test_close (sc);
    test_close (sb);

    /*  Test whether connection rejection is handled decently. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    s1 = test_socket (AF_SP, NN_PAIR);
    test_connect (s1, SOCKET_ADDRESS);
    s2 = test_socket (AF_SP, NN_PAIR);
    test_connect (s2, SOCKET_ADDRESS);
    nn_sleep (100);
    test_close (s2);
    test_close (s1);
    test_close (sb);

    /*  Test two sockets binding to the same address. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    s1 = test_socket (AF_SP, NN_PAIR);
    test_bind (s1, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    nn_sleep (100);
    test_send (sb, "ABC");
    test_recv (sc, "ABC");
    test_close (sb);
    test_send (s1, "ABC");
    test_recv (sc, "ABC");   
    test_close (sc);
    test_close (s1);

    /*  Test closing a socket that is waiting to bind. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    nn_sleep (100);
    s1 = test_socket (AF_SP, NN_PAIR);
    test_bind (s1, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    nn_sleep (100);
    test_send (sb, "ABC");
    test_recv (sc, "ABC");
    test_close (s1);
    test_send (sb, "ABC");
    test_recv (sc, "ABC");
    test_close (sb);
    test_close (sc);

    return 0;
}